

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

bool __thiscall crnlib::dxt_image::can_flip(dxt_image *this,uint axis_index)

{
  uint local_20;
  uint d;
  uint axis_index_local;
  dxt_image *this_local;
  
  if ((((this->m_format == cETC1) || (this->m_format == cETC2)) || (this->m_format == cETC2A)) ||
     ((this->m_format == cETC1S || (this->m_format == cETC2AS)))) {
    this_local._7_1_ = false;
  }
  else {
    if (axis_index == 0) {
      local_20 = this->m_width;
    }
    else {
      local_20 = this->m_height;
    }
    if (((local_20 & 3) == 0) || (local_20 < 5)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool dxt_image::can_flip(uint axis_index)
    {
        if (m_format == cETC1 || m_format == cETC2 || m_format == cETC2A || m_format == cETC1S || m_format == cETC2AS)
        {
            // Can't reliably flip ETCn textures (because of asymmetry in the 555/333 differential coding of subblock colors).
            return false;
        }

        uint d;
        if (!axis_index)
        {
            d = m_width;
        }
        else
        {
            d = m_height;
        }

        if (d & 3)
        {
            if (d > 4)
            {
                return false;
            }
        }

        return true;
    }